

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
gulps::gulps_async_file_output::gulps_async_file_output(gulps_async_file_output *this,string *name)

{
  gulps_async_file_output *local_38;
  code *local_30;
  undefined8 local_28;
  
  gulps_file_output::gulps_file_output(&this->super_gulps_file_output,name);
  (this->super_gulps_file_output).super_gulps_output._vptr_gulps_output =
       (_func_int **)&PTR__gulps_async_file_output_00144bb8;
  (this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>
           ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>
           ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->msg_q).queue_.c.super__Deque_base<gulps::message,_std::allocator<gulps::message>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<gulps::message,_std::allocator<gulps::message>_>::_M_initialize_map
            ((_Deque_base<gulps::message,_std::allocator<gulps::message>_> *)&this->msg_q,0);
  *(undefined8 *)((long)&(this->msg_q).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->msg_q).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->msg_q).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->msg_q).mutex_.super___mutex_base._M_mutex + 8) = 0;
  (this->msg_q).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->msg_q).cond_);
  (this->msg_q).finish = false;
  local_30 = output_main;
  local_28 = 0;
  local_38 = this;
  std::thread::
  thread<void(gulps::gulps_async_file_output::*)(),gulps::gulps_async_file_output*,void>
            (&this->thd,(offset_in_gulps_async_file_output_to_subr *)&local_30,&local_38);
  return;
}

Assistant:

gulps_async_file_output(const std::string& name) : 
			gulps_file_output(name), thd(&gulps_async_file_output::output_main, this)
		{
		}